

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

uchar * nvpair_unpack_descriptor
                  (_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp,int *fds,size_t nfds)

{
  int *piVar1;
  ulong local_48;
  int64_t idx;
  size_t nfds_local;
  int *fds_local;
  size_t *leftp_local;
  uchar *ptr_local;
  nvpair_t *nvp_local;
  uchar *puStack_10;
  _Bool isbe_local;
  
  if (nvp->nvp_type == 6) {
    if (nvp->nvp_datasize == 8) {
      if (*leftp < 8) {
        piVar1 = __errno_location();
        *piVar1 = 0x16;
        puStack_10 = (uchar *)0x0;
      }
      else {
        if (isbe) {
          local_48 = be64dec(ptr);
        }
        else {
          local_48 = le64dec(ptr);
        }
        if ((long)local_48 < 0) {
          piVar1 = __errno_location();
          *piVar1 = 0x16;
          puStack_10 = (uchar *)0x0;
        }
        else if (local_48 < nfds) {
          nvp->nvp_data = (long)fds[local_48];
          puStack_10 = ptr + 8;
          *leftp = *leftp - 8;
        }
        else {
          piVar1 = __errno_location();
          *piVar1 = 0x16;
          puStack_10 = (uchar *)0x0;
        }
      }
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      puStack_10 = (uchar *)0x0;
    }
    return puStack_10;
  }
  __assert_fail("nvp->nvp_type == 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x333,
                "const unsigned char *nvpair_unpack_descriptor(_Bool, nvpair_t *, const unsigned char *, size_t *, const int *, size_t)"
               );
}

Assistant:

const unsigned char *
nvpair_unpack_descriptor(bool isbe, nvpair_t *nvp, const unsigned char *ptr,
    size_t *leftp, const int *fds, size_t nfds)
{
	int64_t idx;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_DESCRIPTOR);

	if (nvp->nvp_datasize != sizeof(idx)) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}
	if (*leftp < sizeof(idx)) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	if (isbe)
		idx = be64dec(ptr);
	else
		idx = le64dec(ptr);

	if (idx < 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	if ((size_t)idx >= nfds) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	nvp->nvp_data = (uint64_t)fds[idx];

	ptr += sizeof(idx);
	*leftp -= sizeof(idx);

	return (ptr);
}